

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix3f.cpp
# Opt level: O1

Matrix3f * __thiscall Matrix3f::transposed(Matrix3f *this)

{
  undefined1 auVar1 [32];
  float *pfVar2;
  int i;
  long lVar3;
  Matrix3f *out;
  float *in_RDI;
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  
  pfVar2 = in_RDI;
  in_RDI[0] = 0.0;
  in_RDI[1] = 0.0;
  in_RDI[2] = 0.0;
  in_RDI[3] = 0.0;
  in_RDI[4] = 0.0;
  in_RDI[5] = 0.0;
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[8] = 0.0;
  lVar3 = 0;
  auVar1 = vpmovsxbq_avx2(ZEXT416(0x60300));
  do {
    auVar5 = vpbroadcastq_avx512vl();
    vpaddq_avx2(auVar5,auVar1);
    auVar4 = vgatherqps_avx512vl(*(undefined8 *)(this->m_elements + lVar3));
    auVar4._12_4_ = in_RDI[3];
    *(undefined1 (*) [16])in_RDI = auVar4;
    lVar3 = lVar3 + 1;
    in_RDI = in_RDI + 3;
  } while (lVar3 != 3);
  return (Matrix3f *)pfVar2;
}

Assistant:

Matrix3f Matrix3f::transposed() const
{
	Matrix3f out;
	for( int i = 0; i < 3; ++i )
	{
		for( int j = 0; j < 3; ++j )
		{
			out( j, i ) = ( *this )( i, j );
		}
	}

	return out;
}